

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
::unget(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::input_stream_adapter>
        *this)

{
  int iVar1;
  int_type iVar2;
  long in_RDI;
  
  *(undefined1 *)(in_RDI + 0x14) = 1;
  *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + -1;
  if (*(long *)(in_RDI + 0x20) == 0) {
    if (*(long *)(in_RDI + 0x28) != 0) {
      *(long *)(in_RDI + 0x28) = *(long *)(in_RDI + 0x28) + -1;
    }
  }
  else {
    *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + -1;
  }
  iVar1 = *(int *)(in_RDI + 0x10);
  iVar2 = std::char_traits<char>::eof();
  if (iVar1 != iVar2) {
    std::vector<char,_std::allocator<char>_>::pop_back
              ((vector<char,_std::allocator<char>_> *)0x16985e);
  }
  return;
}

Assistant:

void unget()
    {
        next_unget = true;

        --position.chars_read_total;

        // in case we "unget" a newline, we have to also decrement the lines_read
        if (position.chars_read_current_line == 0)
        {
            if (position.lines_read > 0)
            {
                --position.lines_read;
            }
        }
        else
        {
            --position.chars_read_current_line;
        }

        if (JSON_HEDLEY_LIKELY(current != std::char_traits<char>::eof()))
        {
            assert(not token_string.empty());
            token_string.pop_back();
        }
    }